

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeSet::serialize(UnicodeSet *this,uint16_t *dest,int32_t destCapacity,UErrorCode *ec)

{
  bool bVar1;
  UBool UVar2;
  int iVar3;
  uint16_t *puVar4;
  int local_4c;
  UChar32 *pUStack_48;
  int32_t i;
  UChar32 *p;
  int local_38;
  int32_t destLength;
  int32_t length;
  int32_t bmpLength;
  UErrorCode *ec_local;
  uint16_t *puStack_20;
  int32_t destCapacity_local;
  uint16_t *dest_local;
  UnicodeSet *this_local;
  
  UVar2 = ::U_FAILURE(*ec);
  if (UVar2 == '\0') {
    if ((destCapacity < 0) || ((0 < destCapacity && (dest == (uint16_t *)0x0)))) {
      *ec = U_ILLEGAL_ARGUMENT_ERROR;
      this_local._4_4_ = 0;
    }
    else {
      local_38 = this->len + -1;
      if (local_38 == 0) {
        if (destCapacity < 1) {
          *ec = U_BUFFER_OVERFLOW_ERROR;
        }
        else {
          *dest = 0;
        }
        this_local._4_4_ = 1;
      }
      else {
        destLength = local_38;
        if (0xffff < this->list[this->len + -2]) {
          if (*this->list < 0x10000) {
            destLength = 0;
            while( true ) {
              bVar1 = false;
              if (destLength < local_38) {
                bVar1 = this->list[destLength] < 0x10000;
              }
              if (!bVar1) break;
              destLength = destLength + 1;
            }
            local_38 = local_38 * 2 - destLength;
          }
          else {
            destLength = 0;
            local_38 = local_38 * 2;
          }
        }
        if (local_38 < 0x8000) {
          iVar3 = 1;
          if (destLength < local_38) {
            iVar3 = 2;
          }
          this_local._4_4_ = local_38 + iVar3;
          if (destCapacity < this_local._4_4_) {
            *ec = U_BUFFER_OVERFLOW_ERROR;
          }
          else {
            *dest = (uint16_t)local_38;
            puStack_20 = dest;
            if (destLength < local_38) {
              *dest = *dest | 0x8000;
              puStack_20 = dest + 1;
              dest[1] = (uint16_t)destLength;
            }
            pUStack_48 = this->list;
            for (local_4c = 0; puStack_20 = puStack_20 + 1, local_4c < destLength;
                local_4c = local_4c + 1) {
              *puStack_20 = (uint16_t)*pUStack_48;
              pUStack_48 = pUStack_48 + 1;
            }
            for (; local_4c < local_38; local_4c = local_4c + 2) {
              puVar4 = puStack_20 + 1;
              *puStack_20 = (uint16_t)((uint)*pUStack_48 >> 0x10);
              puStack_20 = puStack_20 + 2;
              *puVar4 = (uint16_t)*pUStack_48;
              pUStack_48 = pUStack_48 + 1;
            }
          }
        }
        else {
          *ec = U_INDEX_OUTOFBOUNDS_ERROR;
          this_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t UnicodeSet::serialize(uint16_t *dest, int32_t destCapacity, UErrorCode& ec) const {
    int32_t bmpLength, length, destLength;

    if (U_FAILURE(ec)) {
        return 0;
    }

    if (destCapacity<0 || (destCapacity>0 && dest==NULL)) {
        ec=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* count necessary 16-bit units */
    length=this->len-1; // Subtract 1 to ignore final UNICODESET_HIGH
    // assert(length>=0);
    if (length==0) {
        /* empty set */
        if (destCapacity>0) {
            *dest=0;
        } else {
            ec=U_BUFFER_OVERFLOW_ERROR;
        }
        return 1;
    }
    /* now length>0 */

    if (this->list[length-1]<=0xffff) {
        /* all BMP */
        bmpLength=length;
    } else if (this->list[0]>=0x10000) {
        /* all supplementary */
        bmpLength=0;
        length*=2;
    } else {
        /* some BMP, some supplementary */
        for (bmpLength=0; bmpLength<length && this->list[bmpLength]<=0xffff; ++bmpLength) {}
        length=bmpLength+2*(length-bmpLength);
    }
#ifdef DEBUG_SERIALIZE
    printf(">> bmpLength%d length%d len%d\n", bmpLength, length, len);
#endif
    /* length: number of 16-bit array units */
    if (length>0x7fff) {
        /* there are only 15 bits for the length in the first serialized word */
        ec=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    /*
     * total serialized length:
     * number of 16-bit array units (length) +
     * 1 length unit (always) +
     * 1 bmpLength unit (if there are supplementary values)
     */
    destLength=length+((length>bmpLength)?2:1);
    if (destLength<=destCapacity) {
        const UChar32 *p;
        int32_t i;

#ifdef DEBUG_SERIALIZE
        printf("writeHdr\n");
#endif
        *dest=(uint16_t)length;
        if (length>bmpLength) {
            *dest|=0x8000;
            *++dest=(uint16_t)bmpLength;
        }
        ++dest;

        /* write the BMP part of the array */
        p=this->list;
        for (i=0; i<bmpLength; ++i) {
#ifdef DEBUG_SERIALIZE
          printf("writebmp: %x\n", (int)*p);
#endif
            *dest++=(uint16_t)*p++;
        }

        /* write the supplementary part of the array */
        for (; i<length; i+=2) {
#ifdef DEBUG_SERIALIZE
          printf("write32: %x\n", (int)*p);
#endif
            *dest++=(uint16_t)(*p>>16);
            *dest++=(uint16_t)*p++;
        }
    } else {
        ec=U_BUFFER_OVERFLOW_ERROR;
    }
    return destLength;
}